

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O2

void Debug::posixSignalHandler(int signum,siginfo_t *si,void *ucontext)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  PosixCrashHandler *this;
  undefined8 *puVar5;
  _Any_data _Stack_48;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  this = PosixCrashHandler::getInstance();
  PosixCrashHandler::handleCrash(this);
  puVar5 = (undefined8 *)0x3;
  _Exit(3);
  if (puVar5[2] == 0) {
    return;
  }
  if (puVar5[2] != 0) {
    (*(code *)puVar5[3])();
    return;
  }
  std::__throw_bad_function_call();
  std::function<void_()>::function((function<void_()> *)&_Stack_48,(function<void_()> *)si);
  pvVar1 = (void *)*puVar5;
  uVar2 = puVar5[1];
  *puVar5 = _Stack_48._M_unused._M_object;
  puVar5[1] = _Stack_48._8_8_;
  uVar3 = puVar5[2];
  uVar4 = puVar5[3];
  puVar5[2] = uStack_38;
  puVar5[3] = uStack_30;
  _Stack_48._M_unused._M_object = pvVar1;
  _Stack_48._8_8_ = uVar2;
  uStack_38 = uVar3;
  uStack_30 = uVar4;
  std::_Function_base::~_Function_base((_Function_base *)&_Stack_48);
  return;
}

Assistant:

void posixSignalHandler( int signum, siginfo_t* si, void* ucontext ) {
        (void)si;
        (void)ucontext;

        auto &handler = PosixCrashHandler::getInstance();
        handler.handleCrash();

        // If you caught one of the above signals, it is likely you just
        // want to quit your program right now.
        //exit( signum );
        std::_Exit(CHILLOUT_EXIT_CODE);
    }